

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O0

void __thiscall
FPCXTexture::ReadPCX4bits(FPCXTexture *this,BYTE *dst,FileReader *lump,PCXHeader *hdr)

{
  undefined1 *puVar1;
  void *pvVar2;
  long lVar3;
  BYTE *pBVar4;
  BYTE *__s;
  byte *pbVar5;
  undefined1 *local_70;
  BYTE *pLine;
  BYTE *ptr;
  BYTE *src;
  BYTE *srcp;
  BYTE *colorIndex;
  BYTE *line;
  int bytes;
  int c;
  int y;
  int x;
  int rle_value;
  int rle_count;
  PCXHeader *hdr_local;
  FileReader *lump_local;
  BYTE *dst_local;
  FPCXTexture *this_local;
  
  x = 0;
  y = 0;
  puVar1 = (undefined1 *)operator_new__((ulong)hdr->bytesPerScanLine);
  pvVar2 = operator_new__((ulong)(this->super_FTexture).Width);
  lVar3 = FileReader::GetLength(lump);
  pBVar4 = (BYTE *)operator_new__(lVar3 - 0x80);
  lVar3 = FileReader::GetLength(lump);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,pBVar4,lVar3 + -0x80);
  ptr = pBVar4;
  for (bytes = 0; bytes < (int)(uint)(this->super_FTexture).Height; bytes = bytes + 1) {
    __s = dst + (int)(bytes * (uint)(this->super_FTexture).Width);
    memset(__s,0,(ulong)(this->super_FTexture).Width);
    for (line._4_4_ = 0; line._4_4_ < 4; line._4_4_ = line._4_4_ + 1) {
      local_70 = puVar1;
      line._0_4_ = (uint)hdr->bytesPerScanLine;
      while ((uint)line != 0) {
        if (x == 0) {
          pbVar5 = ptr + 1;
          y = (int)*ptr;
          if ((uint)y < 0xc0) {
            x = 1;
            ptr = pbVar5;
          }
          else {
            x = y - 0xc0;
            ptr = ptr + 2;
            y = (int)*pbVar5;
          }
        }
        x = x + -1;
        *local_70 = (char)y;
        local_70 = local_70 + 1;
        line._0_4_ = (uint)line - 1;
      }
      for (c = 0; c < (int)(uint)(this->super_FTexture).Width; c = c + 1) {
        if (((uint)(byte)puVar1[c / 8] & 0x80 >> ((byte)((long)c % 8) & 0x1f)) != 0) {
          __s[c] = __s[c] + (char)(1 << ((byte)line._4_4_ & 0x1f));
        }
      }
    }
  }
  if (pvVar2 != (void *)0x0) {
    operator_delete__(pvVar2);
  }
  if (puVar1 != (undefined1 *)0x0) {
    operator_delete__(puVar1);
  }
  if (pBVar4 != (BYTE *)0x0) {
    operator_delete__(pBVar4);
  }
  return;
}

Assistant:

void FPCXTexture::ReadPCX4bits (BYTE *dst, FileReader & lump, PCXHeader *hdr)
{
	int rle_count = 0, rle_value = 0;
	int x, y, c;
	int bytes;
	BYTE * line = new BYTE[hdr->bytesPerScanLine];
	BYTE * colorIndex = new BYTE[Width];

	BYTE * srcp = new BYTE[lump.GetLength() - sizeof(PCXHeader)];
	lump.Read(srcp, lump.GetLength() - sizeof(PCXHeader));
	BYTE * src = srcp;

	for (y = 0; y < Height; ++y)
	{
		BYTE * ptr = &dst[y * Width];
		memset (ptr, 0, Width * sizeof (BYTE));

		for (c = 0; c < 4; ++c)
		{
			BYTE * pLine = line;

			bytes = hdr->bytesPerScanLine;

			while (bytes--)
			{
				if (rle_count == 0)
				{
					if ( (rle_value = *src++) < 0xc0)
					{
						rle_count = 1;
					}
					else
					{
						rle_count = rle_value - 0xc0;
						rle_value = *src++;
					}
				}

				rle_count--;
				*(pLine++) = rle_value;
			}

			/* compute line's color indexes */
			for (x = 0; x < Width; ++x)
			{
				if (line[x / 8] & (128 >> (x % 8)))
					ptr[x] += (1 << c);
			}
		}
	}

	/* release memory */
	delete [] colorIndex;
	delete [] line;
	delete [] srcp;
}